

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall
google::anon_unknown_1::FlagValue::FlagValue
          (FlagValue *this,void *valbuf,char *type,bool transfer_ownership_of_value)

{
  int iVar1;
  char *__s2;
  bool transfer_ownership_of_value_local;
  char *type_local;
  void *valbuf_local;
  FlagValue *this_local;
  
  this->value_buffer_ = valbuf;
  this->owns_value_ = transfer_ownership_of_value;
  this->type_ = '\0';
  while (this->type_ < '\a') {
    __s2 = TypeName(this);
    iVar1 = strcmp(type,__s2);
    if (iVar1 == 0) break;
    this->type_ = this->type_ + '\x01';
  }
  if ('\x06' < this->type_) {
    __assert_fail("type_ <= FV_MAX_INDEX",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0xfe,
                  "google::(anonymous namespace)::FlagValue::FlagValue(void *, const char *, bool)")
    ;
  }
  return;
}

Assistant:

FlagValue::FlagValue(void* valbuf, const char* type,
                     bool transfer_ownership_of_value)
    : value_buffer_(valbuf),
      owns_value_(transfer_ownership_of_value) {
  for (type_ = 0; type_ <= FV_MAX_INDEX; ++type_) {
    if (!strcmp(type, TypeName())) {
      break;
    }
  }
  assert(type_ <= FV_MAX_INDEX);  // Unknown typename
}